

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O3

size_type __thiscall
phmap::priv::
base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
::size(base_checker<phmap::btree_set<long,_phmap::Less<long>,_std::allocator<long>_>,_std::set<long,_std::less<long>,_std::allocator<long>_>_>
       *this)

{
  char *message;
  AssertHelper local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  internal local_20 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_28._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->tree_).
       super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
       .
       super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
       .tree_.size_;
  local_30.data_ =
       (AssertHelperData *)(this->checker_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_20,"tree_.size()","checker_.size()",(unsigned_long *)&local_28,
             (unsigned_long *)&local_30);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_18 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_18->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/btree_test.cc"
               ,0x138,message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if (local_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_18,local_18);
  }
  return (this->tree_).
         super_btree_set_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
         .
         super_btree_container<phmap::priv::btree<phmap::priv::set_params<long,_phmap::Less<long>,_std::allocator<long>,_256,_false>_>_>
         .tree_.size_;
}

Assistant:

size_type size() const {
        EXPECT_EQ(tree_.size(), checker_.size());
        return tree_.size();
    }